

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboUtil.cpp
# Opt level: O3

ostream * deqp::gls::FboUtil::operator<<(ostream *stream,ImageFormat *format)

{
  ostream *poVar1;
  Enum<int,_2UL> local_30;
  Enum<int,_2UL> local_20;
  
  if (format->unsizedType == 0) {
    local_30.m_value = format->format;
    local_30.m_getName = glu::getTextureFormatName;
    poVar1 = tcu::Format::Enum<int,_2UL>::toStream(&local_30,stream);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(stream,"(format = ",10);
    local_30.m_value = format->format;
    local_30.m_getName = glu::getTextureFormatName;
    poVar1 = tcu::Format::Enum<int,_2UL>::toStream(&local_30,stream);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", type = ",9);
    local_20.m_value = format->unsizedType;
    local_20.m_getName = glu::getTypeName;
    poVar1 = tcu::Format::Enum<int,_2UL>::toStream(&local_20,poVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  }
  return poVar1;
}

Assistant:

std::ostream& operator<< (std::ostream& stream, const ImageFormat& format)
{
	if (format.unsizedType == GL_NONE)
	{
		// sized format
		return stream << glu::getTextureFormatStr(format.format);
	}
	else
	{
		// unsized format
		return stream << "(format = " << glu::getTextureFormatStr(format.format) << ", type = " << glu::getTypeStr(format.unsizedType) << ")";
	}
}